

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O2

SurfaceInteraction *
pbrt::BilinearPatch::InteractionFromIntersection
          (SurfaceInteraction *__return_storage_ptr__,BilinearPatchMesh *mesh,int patchIndex,
          Point2f uv,Float time,Vector3f *wo)

{
  float fVar1;
  Tuple2<pbrt::Point2,_float> *t0;
  Tuple2<pbrt::Point2,_float> *t0_00;
  Tuple2<pbrt::Point2,_float> *t1;
  Tuple2<pbrt::Point2,_float> *t1_00;
  undefined8 uVar3;
  bool bVar4;
  bool bVar5;
  int *piVar6;
  Point3f *pPVar7;
  Point2f *pPVar8;
  Normal3f *pNVar9;
  float fVar10;
  float fVar11;
  undefined1 auVar12 [16];
  Point3fi pi;
  Normal3f dndu;
  Normal3f dndv;
  Normal3f dndvs;
  Vector3f dpdv;
  Vector3f dpdu;
  Normal3f ns;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined4 in_register_00000014;
  int iVar16;
  long lVar17;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  Point2<float> PVar21;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar61 [56];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar30 [16];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar63 [16];
  undefined1 auVar67 [60];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  float fVar68;
  float fVar69;
  float fVar78;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar79 [16];
  float fVar80;
  float fVar82;
  undefined1 auVar81 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  Point3<float> PVar85;
  Vector3<float> VVar86;
  Vector3<float> VVar87;
  Normal3<float> NVar88;
  Normal3<float> NVar89;
  Normal3<float> NVar90;
  Normal3<float> NVar91;
  Vector3f dpdvs;
  Normal3f dndus;
  Normal3f n00;
  Vector3<float> local_298;
  Vector3<float> local_288;
  float local_27c;
  Tuple3<pbrt::Point3,_float> local_278;
  Tuple2<pbrt::Point2,_float> local_268;
  undefined8 uStack_260;
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  Point3f p10;
  undefined1 local_218 [16];
  Point3f p00;
  undefined1 local_1e8 [8];
  float fStack_1e0;
  float fStack_1dc;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  undefined8 uStack_1c0;
  Point3f p11;
  Point3f p01;
  undefined8 uStack_180;
  Tuple3<pbrt::Normal3,_float> local_160;
  float va;
  float fStack_14c;
  float local_148;
  double vb;
  float local_138;
  undefined8 local_130;
  long local_128;
  int *local_120;
  Normal3f n11;
  Normal3f n01;
  Tuple3<pbrt::Point3,_float> local_f8;
  Tuple3<pbrt::Vector3,_float> local_e8;
  Transform r;
  Tuple3<pbrt::Vector3,_float> local_58;
  Point3fi local_48;
  float fVar2;
  undefined1 auVar18 [16];
  ulong uVar60;
  undefined1 auVar62 [56];
  
  uVar3 = local_218._0_8_;
  auVar36._8_56_ = in_register_00001208;
  auVar36._0_8_ = uv.super_Tuple2<pbrt::Point2,_float>;
  local_130 = CONCAT44(in_register_00000014,patchIndex);
  piVar6 = mesh->vertexIndices;
  local_258 = auVar36._0_16_;
  local_248 = vmovshdup_avx(local_258);
  auVar61 = ZEXT856(local_248._8_8_);
  lVar17 = (long)(patchIndex * 4);
  pPVar7 = mesh->p;
  p00.super_Tuple3<pbrt::Point3,_float>.z =
       pPVar7[piVar6[lVar17]].super_Tuple3<pbrt::Point3,_float>.z;
  p00.super_Tuple3<pbrt::Point3,_float>.x =
       pPVar7[piVar6[lVar17]].super_Tuple3<pbrt::Point3,_float>.x;
  p00.super_Tuple3<pbrt::Point3,_float>.y =
       pPVar7[piVar6[lVar17]].super_Tuple3<pbrt::Point3,_float>.y;
  p10.super_Tuple3<pbrt::Point3,_float>.z =
       pPVar7[piVar6[lVar17 + 1]].super_Tuple3<pbrt::Point3,_float>.z;
  p10.super_Tuple3<pbrt::Point3,_float>.x =
       pPVar7[piVar6[lVar17 + 1]].super_Tuple3<pbrt::Point3,_float>.x;
  p10.super_Tuple3<pbrt::Point3,_float>.y =
       pPVar7[piVar6[lVar17 + 1]].super_Tuple3<pbrt::Point3,_float>.y;
  p01.super_Tuple3<pbrt::Point3,_float>.z =
       pPVar7[piVar6[lVar17 + 2]].super_Tuple3<pbrt::Point3,_float>.z;
  p01.super_Tuple3<pbrt::Point3,_float>.x =
       pPVar7[piVar6[lVar17 + 2]].super_Tuple3<pbrt::Point3,_float>.x;
  p01.super_Tuple3<pbrt::Point3,_float>.y =
       pPVar7[piVar6[lVar17 + 2]].super_Tuple3<pbrt::Point3,_float>.y;
  p11.super_Tuple3<pbrt::Point3,_float>.z =
       pPVar7[piVar6[lVar17 + 3]].super_Tuple3<pbrt::Point3,_float>.z;
  p11.super_Tuple3<pbrt::Point3,_float>.x =
       pPVar7[piVar6[lVar17 + 3]].super_Tuple3<pbrt::Point3,_float>.x;
  p11.super_Tuple3<pbrt::Point3,_float>.y =
       pPVar7[piVar6[lVar17 + 3]].super_Tuple3<pbrt::Point3,_float>.y;
  PVar85 = Lerp<pbrt::Point3,float>
                     (local_248._0_4_,&p00.super_Tuple3<pbrt::Point3,_float>,
                      &p01.super_Tuple3<pbrt::Point3,_float>);
  r.m.m[0][2] = PVar85.super_Tuple3<pbrt::Point3,_float>.z;
  auVar31._0_8_ = PVar85.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar31._8_56_ = auVar61;
  r.m.m[0]._0_8_ = vmovlps_avx(auVar31._0_16_);
  auVar61 = ZEXT856((ulong)local_248._8_8_);
  PVar85 = Lerp<pbrt::Point3,float>
                     (local_248._0_4_,&p10.super_Tuple3<pbrt::Point3,_float>,
                      &p11.super_Tuple3<pbrt::Point3,_float>);
  n00.super_Tuple3<pbrt::Normal3,_float>.z = PVar85.super_Tuple3<pbrt::Point3,_float>.z;
  auVar32._0_8_ = PVar85.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar32._8_56_ = auVar61;
  n00.super_Tuple3<pbrt::Normal3,_float>._0_8_ = vmovlps_avx(auVar32._0_16_);
  auVar61 = ZEXT856((ulong)local_258._8_8_);
  PVar85 = Lerp<pbrt::Point3,float>
                     (local_258._0_4_,(Tuple3<pbrt::Point3,_float> *)&r,
                      (Tuple3<pbrt::Point3,_float> *)&n00);
  local_f8.z = PVar85.super_Tuple3<pbrt::Point3,_float>.z;
  auVar33._0_8_ = PVar85.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar33._8_56_ = auVar61;
  local_f8._0_8_ = vmovlps_avx(auVar33._0_16_);
  PVar85 = Lerp<pbrt::Point3,float>
                     ((Float)local_248._0_4_,&p10.super_Tuple3<pbrt::Point3,_float>,
                      &p11.super_Tuple3<pbrt::Point3,_float>);
  local_268.x = PVar85.super_Tuple3<pbrt::Point3,_float>.z;
  local_218._8_8_ = local_218._0_8_;
  local_218._0_8_ = PVar85.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar61 = ZEXT856((ulong)local_248._8_8_);
  PVar85 = Lerp<pbrt::Point3,float>
                     (local_248._0_4_,&p00.super_Tuple3<pbrt::Point3,_float>,
                      &p01.super_Tuple3<pbrt::Point3,_float>);
  auVar34._0_8_ = PVar85.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar34._8_56_ = auVar61;
  auVar18 = vsubps_avx(local_218,auVar34._0_16_);
  fVar11 = local_268.x - PVar85.super_Tuple3<pbrt::Point3,_float>.z;
  local_288.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar18);
  local_288.super_Tuple3<pbrt::Vector3,_float>.z = fVar11;
  PVar85 = Lerp<pbrt::Point3,float>
                     ((Float)local_258._0_4_,&p01.super_Tuple3<pbrt::Point3,_float>,
                      &p11.super_Tuple3<pbrt::Point3,_float>);
  local_218._8_8_ = uVar3;
  local_218._0_8_ = PVar85.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar61 = ZEXT856((ulong)local_258._8_8_);
  local_268.x = PVar85.super_Tuple3<pbrt::Point3,_float>.z;
  PVar85 = Lerp<pbrt::Point3,float>
                     (local_258._0_4_,&p00.super_Tuple3<pbrt::Point3,_float>,
                      &p10.super_Tuple3<pbrt::Point3,_float>);
  auVar19 = local_258;
  auVar35._0_8_ = PVar85.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar35._8_56_ = auVar61;
  auVar30 = vsubps_avx(local_218,auVar35._0_16_);
  auVar36 = ZEXT1664(auVar30);
  local_298.super_Tuple3<pbrt::Vector3,_float>.z =
       local_268.x - PVar85.super_Tuple3<pbrt::Point3,_float>.z;
  uVar3 = vmovlps_avx(auVar30);
  local_298.super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar3;
  local_298.super_Tuple3<pbrt::Vector3,_float>.y = (float)((ulong)uVar3 >> 0x20);
  pPVar8 = mesh->uv;
  local_128 = lVar17;
  local_120 = piVar6;
  if (pPVar8 == (Point2f *)0x0) {
    auVar30 = vmovshdup_avx(auVar30);
    fVar68 = auVar30._0_4_;
    local_268.x = (float)local_258._0_4_;
    local_268.y = (float)local_258._4_4_;
    uStack_260 = local_258._8_8_;
    local_258 = auVar19;
    goto LAB_003f31a8;
  }
  t0 = &pPVar8[piVar6[lVar17]].super_Tuple2<pbrt::Point2,_float>;
  t0_00 = &pPVar8[piVar6[lVar17 + 1]].super_Tuple2<pbrt::Point2,_float>;
  t1 = &pPVar8[piVar6[lVar17 + 2]].super_Tuple2<pbrt::Point2,_float>;
  t1_00 = &pPVar8[piVar6[lVar17 + 3]].super_Tuple2<pbrt::Point2,_float>;
  local_268 = (Tuple2<pbrt::Point2,_float>)Lerp<pbrt::Point2,float>((Float)local_248._0_4_,t0,t1);
  uStack_260 = extraout_XMM0_Qb;
  PVar21 = Lerp<pbrt::Point2,float>((Float)local_248._0_4_,t0_00,t1_00);
  fVar11 = t0->x;
  auVar70._4_4_ = fVar11;
  auVar70._0_4_ = fVar11;
  auVar70._8_4_ = fVar11;
  auVar70._12_4_ = fVar11;
  auVar84._8_4_ = 0x3f800000;
  auVar84._0_8_ = 0x3f8000003f800000;
  auVar84._12_4_ = 0x3f800000;
  fVar68 = t0->y;
  auVar81._4_4_ = fVar68;
  auVar81._0_4_ = fVar68;
  auVar81._8_4_ = fVar68;
  auVar81._12_4_ = fVar68;
  auVar30 = vinsertps_avx(ZEXT416((uint)local_298.super_Tuple3<pbrt::Vector3,_float>.z),
                          ZEXT416((uint)local_288.super_Tuple3<pbrt::Vector3,_float>.z),0x10);
  auVar18 = vinsertps_avx(ZEXT416((uint)t1->x),ZEXT416((uint)t0_00->x),0x10);
  auVar19 = vinsertps_avx(ZEXT416((uint)t1->y),ZEXT416((uint)t0_00->y),0x10);
  auVar18 = vsubps_avx(auVar18,auVar70);
  auVar20 = vsubps_avx(auVar19,auVar81);
  fVar11 = ((fVar11 - t1->x) - t0_00->x) + t1_00->x;
  fVar10 = ((fVar68 - t1->y) - t0_00->y) + t1_00->y;
  auVar71._4_4_ = fVar11;
  auVar71._0_4_ = fVar11;
  auVar71._8_4_ = fVar11;
  auVar71._12_4_ = fVar11;
  auVar79._8_4_ = 0x7fffffff;
  auVar79._0_8_ = 0x7fffffff7fffffff;
  auVar79._12_4_ = 0x7fffffff;
  auVar19 = vfmadd213ps_fma(auVar71,local_258,auVar18);
  auVar22._8_4_ = 0x322bcc77;
  auVar22._0_8_ = 0x322bcc77322bcc77;
  auVar22._12_4_ = 0x322bcc77;
  auVar18 = vandps_avx(auVar19,auVar79);
  uVar60 = vcmpps_avx512vl(auVar18,auVar22,5);
  auVar18 = vdivps_avx512vl(auVar84,auVar19);
  fVar68 = (float)((uint)((byte)uVar60 & 1) * auVar18._0_4_);
  fVar11 = (float)((uint)((byte)(uVar60 >> 1) & 1) * auVar18._4_4_);
  auVar19._4_4_ = fVar11;
  auVar19._0_4_ = fVar68;
  fVar1 = (float)((uint)((byte)(uVar60 >> 2) & 1) * auVar18._8_4_);
  auVar19._8_4_ = fVar1;
  fVar2 = (float)((uint)((byte)(uVar60 >> 3) & 1) * auVar18._12_4_);
  auVar19._12_4_ = fVar2;
  auVar83._0_4_ = auVar30._0_4_ * fVar68;
  auVar83._4_4_ = auVar30._4_4_ * fVar11;
  auVar83._8_4_ = auVar30._8_4_ * fVar1;
  auVar83._12_4_ = auVar30._12_4_ * fVar2;
  auVar19 = vmovshdup_avx(auVar19);
  auVar18 = vhaddps_avx(auVar83,auVar83);
  auVar72._0_4_ =
       local_288.super_Tuple3<pbrt::Vector3,_float>.x * auVar19._0_4_ +
       local_298.super_Tuple3<pbrt::Vector3,_float>.x * fVar68;
  auVar72._4_4_ =
       local_288.super_Tuple3<pbrt::Vector3,_float>.y * auVar19._4_4_ +
       local_298.super_Tuple3<pbrt::Vector3,_float>.y * fVar68;
  auVar72._8_4_ = auVar19._8_4_ * 0.0 + fVar68 * 0.0;
  auVar72._12_4_ = auVar19._12_4_ * 0.0 + fVar68 * 0.0;
  r.m.m[0]._0_8_ = vmovlps_avx(auVar72);
  auVar73._4_4_ = fVar10;
  auVar73._0_4_ = fVar10;
  auVar73._8_4_ = fVar10;
  auVar73._12_4_ = fVar10;
  r.m.m[0][2] = auVar18._0_4_;
  auVar19 = vfmadd213ps_fma(auVar73,local_258,auVar20);
  auVar18 = vandps_avx(auVar19,auVar79);
  uVar60 = vcmpps_avx512vl(auVar18,auVar22,5);
  auVar18 = vdivps_avx512vl(auVar84,auVar19);
  fVar68 = (float)((uint)((byte)uVar60 & 1) * auVar18._0_4_);
  fVar1 = (float)((uint)((byte)(uVar60 >> 1) & 1) * auVar18._4_4_);
  auVar20._4_4_ = fVar1;
  auVar20._0_4_ = fVar68;
  fVar2 = (float)((uint)((byte)(uVar60 >> 2) & 1) * auVar18._8_4_);
  auVar20._8_4_ = fVar2;
  fVar11 = (float)((uint)((byte)(uVar60 >> 3) & 1) * auVar18._12_4_);
  auVar20._12_4_ = fVar11;
  auVar63._0_4_ = auVar30._0_4_ * fVar68;
  auVar63._4_4_ = auVar30._4_4_ * fVar1;
  auVar63._8_4_ = auVar30._8_4_ * fVar2;
  auVar63._12_4_ = auVar30._12_4_ * fVar11;
  auVar30 = vmovshdup_avx(auVar20);
  auVar18 = vhaddps_avx(auVar63,auVar63);
  auVar67 = ZEXT1260(auVar18._4_12_);
  auVar23._0_4_ =
       local_288.super_Tuple3<pbrt::Vector3,_float>.x * auVar30._0_4_ +
       local_298.super_Tuple3<pbrt::Vector3,_float>.x * fVar68;
  auVar23._4_4_ =
       local_288.super_Tuple3<pbrt::Vector3,_float>.y * auVar30._4_4_ +
       local_298.super_Tuple3<pbrt::Vector3,_float>.y * fVar68;
  auVar23._8_4_ = auVar30._8_4_ * 0.0 + fVar68 * 0.0;
  auVar23._12_4_ = auVar30._12_4_ * 0.0 + fVar68 * 0.0;
  auVar61 = ZEXT856(auVar23._8_8_);
  n00.super_Tuple3<pbrt::Normal3,_float>._0_8_ = vmovlps_avx(auVar23);
  n00.super_Tuple3<pbrt::Normal3,_float>.z = auVar18._0_4_;
  VVar86 = Cross<float>((Vector3<float> *)&r,(Vector3<float> *)&n00);
  auVar37._0_8_ = VVar86.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar37._8_56_ = auVar61;
  if (VVar86.super_Tuple3<pbrt::Vector3,_float>.x == 0.0) {
    auVar18 = vmovshdup_avx(auVar37._0_16_);
    auVar61 = ZEXT856(auVar18._8_8_);
    if ((auVar18._0_4_ != 0.0) || (NAN(auVar18._0_4_))) goto LAB_003f2fda;
    auVar61 = ZEXT856(0);
    if ((VVar86.super_Tuple3<pbrt::Vector3,_float>.z != 0.0) ||
       (NAN(VVar86.super_Tuple3<pbrt::Vector3,_float>.z))) goto LAB_003f2fda;
  }
  else {
LAB_003f2fda:
    VVar86 = Cross<float>(&local_288,&local_298);
    auVar38._0_8_ = VVar86.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar38._8_56_ = auVar61;
    auVar62 = auVar61;
    VVar87 = Cross<float>((Vector3<float> *)&r,(Vector3<float> *)&n00);
    auVar64._0_4_ = VVar87.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar64._4_60_ = auVar67;
    auVar39._0_8_ = VVar87.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar39._8_56_ = auVar62;
    auVar30._0_4_ =
         VVar86.super_Tuple3<pbrt::Vector3,_float>.x * VVar87.super_Tuple3<pbrt::Vector3,_float>.x;
    auVar30._4_4_ =
         VVar86.super_Tuple3<pbrt::Vector3,_float>.y * VVar87.super_Tuple3<pbrt::Vector3,_float>.y;
    auVar30._8_4_ = auVar61._0_4_ * auVar62._0_4_;
    auVar30._12_4_ = auVar61._4_4_ * auVar62._4_4_;
    auVar18 = vmovshdup_avx(auVar30);
    auVar18 = vfmadd231ss_fma(auVar18,auVar38._0_16_,auVar39._0_16_);
    auVar18 = vfmadd231ss_fma(auVar18,auVar64._0_16_,
                              ZEXT416((uint)VVar86.super_Tuple3<pbrt::Vector3,_float>.z));
    uVar60 = 0;
    if (auVar18._0_4_ < 0.0) {
      auVar24._0_8_ = n00.super_Tuple3<pbrt::Normal3,_float>._0_8_ ^ 0x8000000080000000;
      auVar24._8_4_ = 0x80000000;
      auVar24._12_4_ = 0x80000000;
      uVar60 = auVar24._8_8_;
      n00.super_Tuple3<pbrt::Normal3,_float>.z = -n00.super_Tuple3<pbrt::Normal3,_float>.z;
      auVar64 = ZEXT1664(CONCAT412(0x80000000,
                                   CONCAT48(0x80000000,
                                            CONCAT44(0x80000000,
                                                     n00.super_Tuple3<pbrt::Normal3,_float>.z))));
      n00.super_Tuple3<pbrt::Normal3,_float>._0_8_ = vmovlps_avx(auVar24);
    }
    auVar67 = auVar64._4_60_;
    auVar62 = ZEXT856(uVar60);
    VVar86 = Cross<float>(&local_288,&local_298);
    local_138 = VVar86.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar40._0_8_ = VVar86.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar40._8_56_ = auVar62;
    vb = (double)vmovlps_avx(auVar40._0_16_);
    VVar86 = Normalize<float>((Vector3<float> *)&vb);
    auVar41._0_8_ = VVar86.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar41._8_56_ = auVar62;
    auVar61 = auVar62;
    VVar87 = Cross<float>((Vector3<float> *)&r,(Vector3<float> *)&n00);
    local_148 = VVar87.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar42._0_8_ = VVar87.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar42._8_56_ = auVar61;
    _va = vmovlps_avx(auVar42._0_16_);
    VVar87 = Normalize<float>((Vector3<float> *)&va);
    auVar65._0_4_ = VVar87.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar65._4_60_ = auVar67;
    auVar43._0_8_ = VVar87.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar43._8_56_ = auVar61;
    vb = -0.001;
    auVar74._0_4_ =
         VVar86.super_Tuple3<pbrt::Vector3,_float>.x * VVar87.super_Tuple3<pbrt::Vector3,_float>.x;
    auVar74._4_4_ =
         VVar86.super_Tuple3<pbrt::Vector3,_float>.y * VVar87.super_Tuple3<pbrt::Vector3,_float>.y;
    auVar74._8_4_ = auVar62._0_4_ * auVar61._0_4_;
    auVar74._12_4_ = auVar62._4_4_ * auVar61._4_4_;
    auVar18 = vmovshdup_avx(auVar74);
    auVar18 = vfmadd231ss_fma(auVar18,auVar41._0_16_,auVar43._0_16_);
    auVar18 = vfmadd231ss_fma(auVar18,auVar65._0_16_,
                              ZEXT416((uint)VVar86.super_Tuple3<pbrt::Vector3,_float>.z));
    va = auVar18._0_4_;
    if (auVar18._0_4_ < -0.001) {
      LogFatal<char_const(&)[64],char_const(&)[6],char_const(&)[64],float&,char_const(&)[6],double&>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/shapes.h"
                 ,0x589,"Check failed: %s >= %s with %s = %s, %s = %s",
                 (char (*) [64])"Dot(Normalize(Cross(dpdu, dpdv)), Normalize(Cross(dpds, dpdt)))",
                 (char (*) [6])"-1e-3",
                 (char (*) [64])"Dot(Normalize(Cross(dpdu, dpdv)), Normalize(Cross(dpds, dpdt)))",
                 &va,(char (*) [6])"-1e-3",&vb);
    }
    local_288.super_Tuple3<pbrt::Vector3,_float>.x = r.m.m[0][0];
    local_288.super_Tuple3<pbrt::Vector3,_float>.y = r.m.m[0][1];
    local_288.super_Tuple3<pbrt::Vector3,_float>.z = r.m.m[0][2];
    local_298.super_Tuple3<pbrt::Vector3,_float>.x = n00.super_Tuple3<pbrt::Normal3,_float>.x;
    local_298.super_Tuple3<pbrt::Vector3,_float>.y = n00.super_Tuple3<pbrt::Normal3,_float>.y;
    local_298.super_Tuple3<pbrt::Vector3,_float>.z = n00.super_Tuple3<pbrt::Normal3,_float>.z;
  }
  auVar18._8_8_ = 0;
  auVar18._0_4_ = local_288.super_Tuple3<pbrt::Vector3,_float>.x;
  auVar18._4_4_ = local_288.super_Tuple3<pbrt::Vector3,_float>.y;
  fVar11 = 1.0 - (float)local_258._0_4_;
  local_1d8 = PVar21.super_Tuple2<pbrt::Point2,_float>.x;
  fStack_1d4 = PVar21.super_Tuple2<pbrt::Point2,_float>.y;
  fStack_1d0 = (float)extraout_XMM0_Qb_00;
  fStack_1cc = (float)((ulong)extraout_XMM0_Qb_00 >> 0x20);
  local_268.y = fVar11 * local_268.y + (float)local_258._0_4_ * fStack_1d4;
  local_268.x = fVar11 * local_268.x + (float)local_258._0_4_ * local_1d8;
  uStack_260 = CONCAT44(fVar11 * uStack_260._4_4_ + (float)local_258._0_4_ * fStack_1cc,
                        fVar11 * (float)uStack_260 + (float)local_258._0_4_ * fStack_1d0);
  auVar36 = ZEXT464((uint)local_298.super_Tuple3<pbrt::Vector3,_float>.x);
  fVar11 = local_288.super_Tuple3<pbrt::Vector3,_float>.z;
  fVar68 = local_298.super_Tuple3<pbrt::Vector3,_float>.y;
LAB_003f31a8:
  auVar61 = auVar36._8_56_;
  auVar67 = (undefined1  [60])0x0;
  fVar1 = ((p00.super_Tuple3<pbrt::Point3,_float>.x - p01.super_Tuple3<pbrt::Point3,_float>.x) -
          p10.super_Tuple3<pbrt::Point3,_float>.x) + p11.super_Tuple3<pbrt::Point3,_float>.x;
  fVar2 = ((p00.super_Tuple3<pbrt::Point3,_float>.y - p01.super_Tuple3<pbrt::Point3,_float>.y) -
          p10.super_Tuple3<pbrt::Point3,_float>.y) + p11.super_Tuple3<pbrt::Point3,_float>.y;
  fVar10 = ((p00.super_Tuple3<pbrt::Point3,_float>.z - p01.super_Tuple3<pbrt::Point3,_float>.z) -
           p10.super_Tuple3<pbrt::Point3,_float>.z) + p11.super_Tuple3<pbrt::Point3,_float>.z;
  auVar30 = vmovshdup_avx(auVar18);
  fVar69 = auVar30._0_4_;
  auVar30 = vfmadd231ss_fma(ZEXT416((uint)(fVar69 * fVar69)),auVar18,auVar18);
  auVar19 = auVar36._0_16_;
  auVar18 = vfmadd231ss_fma(ZEXT416((uint)(fVar69 * fVar68)),auVar19,auVar18);
  auVar19 = vfmadd231ss_fma(ZEXT416((uint)(fVar68 * fVar68)),auVar19,auVar19);
  auVar30 = vfmadd231ss_fma(auVar30,ZEXT416((uint)fVar11),ZEXT416((uint)fVar11));
  auVar18 = vfmadd231ss_fma(auVar18,ZEXT416((uint)local_298.super_Tuple3<pbrt::Vector3,_float>.z),
                            ZEXT416((uint)fVar11));
  auVar19 = vfmadd231ss_fma(auVar19,ZEXT416((uint)local_298.super_Tuple3<pbrt::Vector3,_float>.z),
                            ZEXT416((uint)local_298.super_Tuple3<pbrt::Vector3,_float>.z));
  local_27c = auVar30._0_4_;
  fVar78 = auVar18._0_4_;
  fVar69 = auVar19._0_4_;
  VVar86 = Cross<float>(&local_288,&local_298);
  r.m.m[0][2] = VVar86.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar44._0_8_ = VVar86.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar44._8_56_ = auVar61;
  r.m.m[0]._0_8_ = vmovlps_avx(auVar44._0_16_);
  VVar86 = Normalize<float>((Vector3<float> *)&r);
  auVar66._0_4_ = VVar86.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar66._4_60_ = auVar67;
  auVar45._0_8_ = VVar86.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar45._8_56_ = auVar61;
  auVar19 = auVar45._0_16_;
  auVar18 = vmovshdup_avx(auVar19);
  auVar22 = ZEXT816(0) << 0x40;
  auVar30 = vfmadd231ss_fma(ZEXT416((uint)(auVar18._0_4_ * 0.0)),auVar19,auVar22);
  auVar18 = vfmadd231ss_fma(ZEXT416((uint)(auVar18._0_4_ * fVar2)),auVar19,ZEXT416((uint)fVar1));
  auVar18 = vfmadd231ss_fma(auVar18,auVar66._0_16_,ZEXT416((uint)fVar10));
  auVar30 = vfmadd231ss_fma(auVar30,auVar66._0_16_,auVar22);
  auVar19 = vfmsub213ss_fma(ZEXT416((uint)fVar69),ZEXT416((uint)local_27c),
                            ZEXT416((uint)(fVar78 * fVar78)));
  auVar23 = ZEXT416((uint)fVar78);
  auVar20 = vfnmadd231ss_fma(ZEXT416((uint)(fVar78 * fVar78)),auVar23,auVar23);
  fVar11 = auVar19._0_4_ + auVar20._0_4_;
  uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar11),auVar22,0);
  auVar19 = vfmsub231ss_fma(ZEXT416((uint)(local_27c * auVar18._0_4_)),auVar30,auVar23);
  fVar10 = (float)((uint)!(bool)((byte)uVar3 & 1) * (int)(1.0 / fVar11));
  fVar68 = fVar10 * auVar19._0_4_;
  auVar19 = vfmsub231ss_fma(ZEXT416((uint)(fVar69 * auVar30._0_4_)),auVar18,auVar23);
  fVar1 = fVar10 * auVar19._0_4_;
  fVar11 = local_298.super_Tuple3<pbrt::Vector3,_float>.z * fVar68 +
           local_288.super_Tuple3<pbrt::Vector3,_float>.z * fVar1;
  auVar19 = vfmsub231ss_fma(ZEXT416((uint)(fVar69 * auVar18._0_4_)),auVar30,ZEXT416((uint)fVar78));
  fVar80 = local_298.super_Tuple3<pbrt::Vector3,_float>.x * fVar68;
  fVar82 = local_298.super_Tuple3<pbrt::Vector3,_float>.y * fVar68;
  auVar18 = vfmsub231ss_fma(ZEXT416((uint)(local_27c * auVar30._0_4_)),ZEXT416((uint)fVar78),auVar18
                           );
  fVar2 = fVar10 * auVar19._0_4_;
  fVar10 = fVar10 * auVar18._0_4_;
  fVar69 = local_288.super_Tuple3<pbrt::Vector3,_float>.x;
  fVar78 = local_288.super_Tuple3<pbrt::Vector3,_float>.y;
  auVar75._8_4_ = 0x7fffffff;
  auVar75._0_8_ = 0x7fffffff7fffffff;
  auVar75._12_4_ = 0x7fffffff;
  local_1e8._4_4_ = fVar78 * fVar2 + local_298.super_Tuple3<pbrt::Vector3,_float>.y * fVar10;
  local_1e8._0_4_ = fVar69 * fVar2 + local_298.super_Tuple3<pbrt::Vector3,_float>.x * fVar10;
  fStack_1e0 = fVar2 * 0.0 + fVar10 * 0.0;
  fStack_1dc = fVar2 * 0.0 + fVar10 * 0.0;
  local_27c = local_288.super_Tuple3<pbrt::Vector3,_float>.z * fVar2 +
              local_298.super_Tuple3<pbrt::Vector3,_float>.z * fVar10;
  auVar25._8_8_ = 0;
  auVar25._0_4_ = p00.super_Tuple3<pbrt::Point3,_float>.x;
  auVar25._4_4_ = p00.super_Tuple3<pbrt::Point3,_float>.y;
  auVar18 = vandps_avx(ZEXT416((uint)p00.super_Tuple3<pbrt::Point3,_float>.z),auVar75);
  auVar30 = vandps_avx(auVar25,auVar75);
  n00.super_Tuple3<pbrt::Normal3,_float>._0_8_ = vmovlps_avx(auVar30);
  auVar26._8_8_ = 0;
  auVar26._0_4_ = p10.super_Tuple3<pbrt::Point3,_float>.x;
  auVar26._4_4_ = p10.super_Tuple3<pbrt::Point3,_float>.y;
  n00.super_Tuple3<pbrt::Normal3,_float>.z = auVar18._0_4_;
  auVar18 = vandps_avx(auVar26,auVar75);
  auVar61 = ZEXT856(auVar18._8_8_);
  auVar30 = vandps_avx(ZEXT416((uint)p10.super_Tuple3<pbrt::Point3,_float>.z),auVar75);
  _va = vmovlps_avx(auVar18);
  local_148 = auVar30._0_4_;
  PVar85 = Max<pbrt::Point3,float>
                     ((Tuple3<pbrt::Point3,_float> *)&n00,(Tuple3<pbrt::Point3,_float> *)&va);
  r.m.m[0][2] = PVar85.super_Tuple3<pbrt::Point3,_float>.z;
  auVar46._0_8_ = PVar85.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar46._8_56_ = auVar61;
  r.m.m[0]._0_8_ = vmovlps_avx(auVar46._0_16_);
  auVar27._8_8_ = 0;
  auVar27._0_4_ = p01.super_Tuple3<pbrt::Point3,_float>.x;
  auVar27._4_4_ = p01.super_Tuple3<pbrt::Point3,_float>.y;
  auVar76._8_4_ = 0x7fffffff;
  auVar76._0_8_ = 0x7fffffff7fffffff;
  auVar76._12_4_ = 0x7fffffff;
  auVar18 = vandps_avx(auVar27,auVar76);
  auVar30 = vandps_avx(ZEXT416((uint)p01.super_Tuple3<pbrt::Point3,_float>.z),auVar76);
  n11.super_Tuple3<pbrt::Normal3,_float>._0_8_ = vmovlps_avx(auVar18);
  auVar28._8_8_ = 0;
  auVar28._0_4_ = p11.super_Tuple3<pbrt::Point3,_float>.x;
  auVar28._4_4_ = p11.super_Tuple3<pbrt::Point3,_float>.y;
  n11.super_Tuple3<pbrt::Normal3,_float>.z = auVar30._0_4_;
  auVar18 = vandps_avx(auVar28,auVar76);
  auVar61 = ZEXT856(auVar18._8_8_);
  auVar30 = vandps_avx(ZEXT416((uint)p11.super_Tuple3<pbrt::Point3,_float>.z),auVar76);
  uVar3 = vmovlps_avx(auVar18);
  local_278.x = (float)uVar3;
  local_278.y = (float)((ulong)uVar3 >> 0x20);
  local_278.z = auVar30._0_4_;
  PVar85 = Max<pbrt::Point3,float>((Tuple3<pbrt::Point3,_float> *)&n11,&local_278);
  n01.super_Tuple3<pbrt::Normal3,_float>.z = PVar85.super_Tuple3<pbrt::Point3,_float>.z;
  auVar47._0_8_ = PVar85.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar47._8_56_ = auVar61;
  n01.super_Tuple3<pbrt::Normal3,_float>._0_8_ = vmovlps_avx(auVar47._0_16_);
  PVar85 = Max<pbrt::Point3,float>
                     ((Tuple3<pbrt::Point3,_float> *)&r,(Tuple3<pbrt::Point3,_float> *)&n01);
  auVar48._0_8_ = PVar85.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar48._8_56_ = auVar61;
  auVar12._8_4_ = 0x34800002;
  auVar12._0_8_ = 0x3480000234800002;
  auVar12._12_4_ = 0x34800002;
  auVar18 = vmulps_avx512vl(auVar48._0_16_,auVar12);
  local_138 = PVar85.super_Tuple3<pbrt::Point3,_float>.z * 2.3841864e-07;
  vb = (double)vmovlps_avx(auVar18);
  if (mesh->faceIndices == (int *)0x0) {
    iVar16 = 0;
  }
  else {
    iVar16 = mesh->faceIndices[(int)local_130];
  }
  bVar4 = mesh->reverseOrientation;
  bVar5 = mesh->transformSwapsHandedness;
  Point3fi::Point3fi(&local_48,(Point3f *)&local_f8,(Vector3f *)&vb);
  dpdu.super_Tuple3<pbrt::Vector3,_float>.z = local_288.super_Tuple3<pbrt::Vector3,_float>.z;
  dpdu.super_Tuple3<pbrt::Vector3,_float>.x = local_288.super_Tuple3<pbrt::Vector3,_float>.x;
  dpdu.super_Tuple3<pbrt::Vector3,_float>.y = local_288.super_Tuple3<pbrt::Vector3,_float>.y;
  dpdv.super_Tuple3<pbrt::Vector3,_float>.y = local_298.super_Tuple3<pbrt::Vector3,_float>.y;
  dpdv.super_Tuple3<pbrt::Vector3,_float>.x = local_298.super_Tuple3<pbrt::Vector3,_float>.x;
  dpdv.super_Tuple3<pbrt::Vector3,_float>.z = local_298.super_Tuple3<pbrt::Vector3,_float>.z;
  r.m.m[0]._0_8_ = vmovlps_avx(_local_1e8);
  r.m.m[0][2] = local_27c;
  auVar13._4_4_ = fVar78 * fVar1 + fVar82;
  auVar13._0_4_ = fVar69 * fVar1 + fVar80;
  auVar13._8_4_ = fVar1 * 0.0 + fVar68 * 0.0;
  auVar13._12_4_ = fVar1 * 0.0 + fVar68 * 0.0;
  n00.super_Tuple3<pbrt::Normal3,_float>._0_8_ = vmovlps_avx(auVar13);
  pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y =
       local_48.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y;
  pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x =
       local_48.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x;
  pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z =
       local_48.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z;
  dndu.super_Tuple3<pbrt::Normal3,_float>.z = fVar11;
  dndu.super_Tuple3<pbrt::Normal3,_float>.x = n00.super_Tuple3<pbrt::Normal3,_float>.x;
  dndu.super_Tuple3<pbrt::Normal3,_float>.y = n00.super_Tuple3<pbrt::Normal3,_float>.y;
  dndv.super_Tuple3<pbrt::Normal3,_float>.z = local_27c;
  dndv.super_Tuple3<pbrt::Normal3,_float>.x = r.m.m[0][0];
  dndv.super_Tuple3<pbrt::Normal3,_float>.y = r.m.m[0][1];
  n00.super_Tuple3<pbrt::Normal3,_float>.z = fVar11;
  SurfaceInteraction::SurfaceInteraction
            (__return_storage_ptr__,pi,(Point2f)local_268,
             (Vector3f)wo->super_Tuple3<pbrt::Vector3,_float>,dpdu,dpdv,dndu,dndv,time,
             bVar4 != bVar5);
  __return_storage_ptr__->faceIndex = iVar16;
  pNVar9 = mesh->n;
  if (pNVar9 != (Normal3f *)0x0) {
    auVar61 = ZEXT856((ulong)local_248._8_8_);
    n00.super_Tuple3<pbrt::Normal3,_float>.z =
         pNVar9[local_120[local_128]].super_Tuple3<pbrt::Normal3,_float>.z;
    n00.super_Tuple3<pbrt::Normal3,_float>.x =
         pNVar9[local_120[local_128]].super_Tuple3<pbrt::Normal3,_float>.x;
    n00.super_Tuple3<pbrt::Normal3,_float>.y =
         pNVar9[local_120[local_128]].super_Tuple3<pbrt::Normal3,_float>.y;
    local_148 = pNVar9[local_120[local_128 + 1]].super_Tuple3<pbrt::Normal3,_float>.z;
    va = pNVar9[local_120[local_128 + 1]].super_Tuple3<pbrt::Normal3,_float>.x;
    fStack_14c = pNVar9[local_120[local_128 + 1]].super_Tuple3<pbrt::Normal3,_float>.y;
    n01.super_Tuple3<pbrt::Normal3,_float>.z =
         pNVar9[local_120[local_128 + 2]].super_Tuple3<pbrt::Normal3,_float>.z;
    n01.super_Tuple3<pbrt::Normal3,_float>.x =
         pNVar9[local_120[local_128 + 2]].super_Tuple3<pbrt::Normal3,_float>.x;
    n01.super_Tuple3<pbrt::Normal3,_float>.y =
         pNVar9[local_120[local_128 + 2]].super_Tuple3<pbrt::Normal3,_float>.y;
    n11.super_Tuple3<pbrt::Normal3,_float>.z =
         pNVar9[local_120[local_128 + 3]].super_Tuple3<pbrt::Normal3,_float>.z;
    n11.super_Tuple3<pbrt::Normal3,_float>.x =
         pNVar9[local_120[local_128 + 3]].super_Tuple3<pbrt::Normal3,_float>.x;
    n11.super_Tuple3<pbrt::Normal3,_float>.y =
         pNVar9[local_120[local_128 + 3]].super_Tuple3<pbrt::Normal3,_float>.y;
    NVar88 = Lerp<pbrt::Normal3,float>
                       (local_248._0_4_,&n00.super_Tuple3<pbrt::Normal3,_float>,
                        &n01.super_Tuple3<pbrt::Normal3,_float>);
    r.m.m[0][2] = NVar88.super_Tuple3<pbrt::Normal3,_float>.z;
    auVar49._0_8_ = NVar88.super_Tuple3<pbrt::Normal3,_float>._0_8_;
    auVar49._8_56_ = auVar61;
    r.m.m[0]._0_8_ = vmovlps_avx(auVar49._0_16_);
    auVar61 = ZEXT856((ulong)local_248._8_8_);
    NVar88 = Lerp<pbrt::Normal3,float>
                       (local_248._0_4_,(Tuple3<pbrt::Normal3,_float> *)&va,
                        &n11.super_Tuple3<pbrt::Normal3,_float>);
    local_160.z = NVar88.super_Tuple3<pbrt::Normal3,_float>.z;
    auVar50._0_8_ = NVar88.super_Tuple3<pbrt::Normal3,_float>._0_8_;
    auVar50._8_56_ = auVar61;
    local_160._0_8_ = vmovlps_avx(auVar50._0_16_);
    auVar61 = ZEXT856((ulong)local_258._8_8_);
    NVar88 = Lerp<pbrt::Normal3,float>
                       (local_258._0_4_,(Tuple3<pbrt::Normal3,_float> *)&r,&local_160);
    local_278.z = NVar88.super_Tuple3<pbrt::Normal3,_float>.z;
    auVar51._0_8_ = NVar88.super_Tuple3<pbrt::Normal3,_float>._0_8_;
    auVar51._8_56_ = auVar61;
    uVar3 = vmovlps_avx(auVar51._0_16_);
    local_278.x = (float)uVar3;
    local_278.y = (float)((ulong)uVar3 >> 0x20);
    auVar29._0_4_ =
         NVar88.super_Tuple3<pbrt::Normal3,_float>.x * NVar88.super_Tuple3<pbrt::Normal3,_float>.x;
    auVar29._4_4_ =
         NVar88.super_Tuple3<pbrt::Normal3,_float>.y * NVar88.super_Tuple3<pbrt::Normal3,_float>.y;
    auVar29._8_4_ = auVar61._0_4_ * auVar61._0_4_;
    auVar29._12_4_ = auVar61._4_4_ * auVar61._4_4_;
    auVar18 = vhaddps_avx(auVar29,auVar29);
    auVar61 = (undefined1  [56])0x0;
    if (0.0 < local_278.z * local_278.z + auVar18._0_4_) {
      NVar88 = Normalize<float>((Normal3<float> *)&local_278);
      local_278.z = NVar88.super_Tuple3<pbrt::Normal3,_float>.z;
      auVar52._0_8_ = NVar88.super_Tuple3<pbrt::Normal3,_float>._0_8_;
      auVar52._8_56_ = auVar61;
      uVar3 = vmovlps_avx(auVar52._0_16_);
      local_278.x = (float)uVar3;
      local_278.y = (float)((ulong)uVar3 >> 0x20);
      NVar88 = Normalize<float>(&(__return_storage_ptr__->super_Interaction).n);
      r.m.m[0][2] = NVar88.super_Tuple3<pbrt::Normal3,_float>.z;
      auVar53._0_8_ = NVar88.super_Tuple3<pbrt::Normal3,_float>._0_8_;
      auVar53._8_56_ = auVar61;
      auVar30 = auVar53._0_16_;
      r.m.m[0]._0_8_ = vmovlps_avx(auVar30);
      local_e8.y = local_278.y;
      local_e8.x = local_278.x;
      auVar61 = (undefined1  [56])0x0;
      local_e8.z = local_278.z;
      local_268.x = r.m.m[0][2];
      VVar86 = Cross<float>((Vector3<float> *)&r,(Vector3<float> *)&local_e8);
      local_160.z = VVar86.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar54._0_8_ = VVar86.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar54._8_56_ = auVar61;
      auVar77._0_4_ =
           VVar86.super_Tuple3<pbrt::Vector3,_float>.x * VVar86.super_Tuple3<pbrt::Vector3,_float>.x
      ;
      auVar77._4_4_ =
           VVar86.super_Tuple3<pbrt::Vector3,_float>.y * VVar86.super_Tuple3<pbrt::Vector3,_float>.y
      ;
      auVar77._8_4_ = auVar61._0_4_ * auVar61._0_4_;
      auVar77._12_4_ = auVar61._4_4_ * auVar61._4_4_;
      local_160._0_8_ = vmovlps_avx(auVar54._0_16_);
      auVar18 = vhaddps_avx(auVar77,auVar77);
      if (1e-14 < local_160.z * local_160.z + auVar18._0_4_) {
        NVar88 = Lerp<pbrt::Normal3,float>
                           ((Float)local_248._0_4_,(Tuple3<pbrt::Normal3,_float> *)&va,
                            &n11.super_Tuple3<pbrt::Normal3,_float>);
        auVar61 = ZEXT856((ulong)local_248._8_8_);
        NVar89 = Lerp<pbrt::Normal3,float>
                           (local_248._0_4_,&n00.super_Tuple3<pbrt::Normal3,_float>,
                            &n01.super_Tuple3<pbrt::Normal3,_float>);
        auVar55._0_8_ = NVar89.super_Tuple3<pbrt::Normal3,_float>._0_8_;
        auVar55._8_56_ = auVar61;
        auVar15._8_8_ = uStack_180;
        auVar15._0_8_ = NVar88.super_Tuple3<pbrt::Normal3,_float>._0_8_;
        local_248 = vsubps_avx(auVar15,auVar55._0_16_);
        NVar90 = Lerp<pbrt::Normal3,float>
                           ((Float)local_258._0_4_,&n01.super_Tuple3<pbrt::Normal3,_float>,
                            &n11.super_Tuple3<pbrt::Normal3,_float>);
        auVar61 = ZEXT856((ulong)local_258._8_8_);
        NVar91 = Lerp<pbrt::Normal3,float>
                           (local_258._0_4_,&n00.super_Tuple3<pbrt::Normal3,_float>,
                            (Tuple3<pbrt::Normal3,_float> *)&va);
        auVar56._0_8_ = NVar91.super_Tuple3<pbrt::Normal3,_float>._0_8_;
        auVar56._8_56_ = auVar61;
        auVar14._8_8_ = uStack_1c0;
        auVar14._0_8_ = NVar90.super_Tuple3<pbrt::Normal3,_float>._0_8_;
        local_258 = vsubps_avx(auVar14,auVar56._0_16_);
        auVar61 = (undefined1  [56])0x0;
        VVar86 = Normalize<float>((Vector3<float> *)&local_160);
        local_160.z = VVar86.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar57._0_8_ = VVar86.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar57._8_56_ = auVar61;
        local_160._0_8_ = vmovlps_avx(auVar57._0_16_);
        auVar18 = vmovshdup_avx(auVar30);
        auVar18 = vfmadd132ss_fma(auVar18,ZEXT416((uint)(local_268.x * local_278.z)),
                                  ZEXT416((uint)local_278.y));
        auVar19 = vfmsub213ss_fma(ZEXT416((uint)local_278.z),ZEXT416((uint)local_268.x),
                                  ZEXT416((uint)(local_268.x * local_278.z)));
        auVar30 = vfmadd132ss_fma(auVar30,ZEXT416((uint)(auVar18._0_4_ + auVar19._0_4_)),
                                  ZEXT416((uint)local_278.x));
        auVar18 = vfnmadd231ss_fma(SUB6416(ZEXT464(0x3f800000),0),auVar30,auVar30);
        auVar18 = vmaxss_avx(auVar18,ZEXT816(0) << 0x20);
        auVar18 = vsqrtss_avx(auVar18,auVar18);
        auVar61 = ZEXT856(auVar18._8_8_);
        Rotate(&r,auVar18._0_4_,auVar30._0_4_,(Vector3f)VVar86.super_Tuple3<pbrt::Vector3,_float>);
        VVar86 = Transform::operator()(&r,&local_288);
        local_e8.z = VVar86.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar58._0_8_ = VVar86.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar58._8_56_ = auVar61;
        local_e8._0_8_ = vmovlps_avx(auVar58._0_16_);
        VVar86 = Transform::operator()(&r,&local_298);
        local_268.x = VVar86.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar61 = (undefined1  [56])0x0;
        local_58.y = local_278.y;
        local_58.x = local_278.x;
        local_58.z = local_278.z;
        VVar87 = GramSchmidt<float>((Vector3<float> *)&local_e8,(Vector3<float> *)&local_58);
        auVar18 = local_248;
        local_e8.z = VVar87.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar59._0_8_ = VVar87.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar59._8_56_ = auVar61;
        local_e8._0_8_ = vmovlps_avx(auVar59._0_16_);
        ns.super_Tuple3<pbrt::Normal3,_float>.y = local_278.y;
        ns.super_Tuple3<pbrt::Normal3,_float>.x = local_278.x;
        ns.super_Tuple3<pbrt::Normal3,_float>.z = local_278.z;
        uVar3 = vmovlps_avx(local_258);
        dndvs.super_Tuple3<pbrt::Normal3,_float>.z =
             NVar90.super_Tuple3<pbrt::Normal3,_float>.z -
             NVar91.super_Tuple3<pbrt::Normal3,_float>.z;
        dndvs.super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)uVar3;
        dndvs.super_Tuple3<pbrt::Normal3,_float>.y = (float)(int)((ulong)uVar3 >> 0x20);
        dpdvs.super_Tuple3<pbrt::Vector3,_float>.z = local_268.x;
        dpdvs.super_Tuple3<pbrt::Vector3,_float>.x =
             (float)(int)VVar86.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        dpdvs.super_Tuple3<pbrt::Vector3,_float>.y =
             (float)(int)((ulong)VVar86.super_Tuple3<pbrt::Vector3,_float>._0_8_ >> 0x20);
        dndus.super_Tuple3<pbrt::Normal3,_float>.z =
             NVar88.super_Tuple3<pbrt::Normal3,_float>.z -
             NVar89.super_Tuple3<pbrt::Normal3,_float>.z;
        dndus.super_Tuple3<pbrt::Normal3,_float>.x = (float)local_248._0_4_;
        dndus.super_Tuple3<pbrt::Normal3,_float>.y = (float)local_248._4_4_;
        local_248 = auVar18;
        SurfaceInteraction::SetShadingGeometry
                  (__return_storage_ptr__,ns,(Vector3f)VVar87.super_Tuple3<pbrt::Vector3,_float>,
                   dpdvs,dndus,dndvs,true);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

InteractionFromIntersection(const BilinearPatchMesh *mesh,
                                                          int patchIndex, Point2f uv,
                                                          Float time,
                                                          const Vector3f &wo) {
        // Compute bilinear patch intersection point, $\dpdu$, and $\dpdv$
        const int *v = &mesh->vertexIndices[4 * patchIndex];
        Point3f p00 = mesh->p[v[0]], p10 = mesh->p[v[1]], p01 = mesh->p[v[2]],
                p11 = mesh->p[v[3]];
        Point3f pHit = Lerp(uv[0], Lerp(uv[1], p00, p01), Lerp(uv[1], p10, p11));
        Vector3f dpdu = Lerp(uv[1], p10, p11) - Lerp(uv[1], p00, p01);
        Vector3f dpdv = Lerp(uv[0], p01, p11) - Lerp(uv[0], p00, p10);

        Point2f uvTex = uv;
        if (mesh->uv != nullptr) {
            // Compute texture coordinates for bilinear patch intersection point
            const Point2f &uv00 = mesh->uv[v[0]], &uv10 = mesh->uv[v[1]];
            const Point2f &uv01 = mesh->uv[v[2]], &uv11 = mesh->uv[v[3]];
            uvTex = Lerp(uv[0], Lerp(uv[1], uv00, uv01), Lerp(uv[1], uv10, uv11));
            // Update bilinear patch $\dpdu$ and $\dpdv$ accounting for texture
            // coordinates Compute partial derivatives of $(u,v)$ with respect to
            // interpolated texture coordinates
            Float dsdu =
                -uv00[0] + uv10[0] + uv[1] * (uv00[0] - uv01[0] - uv10[0] + uv11[0]);
            Float dsdv =
                -uv00[0] + uv01[0] + uv[0] * (uv00[0] - uv01[0] - uv10[0] + uv11[0]);
            Float dtdu =
                -uv00[1] + uv10[1] + uv[1] * (uv00[1] - uv01[1] - uv10[1] + uv11[1]);
            Float dtdv =
                -uv00[1] + uv01[1] + uv[0] * (uv00[1] - uv01[1] - uv10[1] + uv11[1]);
            Float duds = std::abs(dsdu) < 1e-8f ? 0 : 1 / dsdu;
            Float dvds = std::abs(dsdv) < 1e-8f ? 0 : 1 / dsdv;
            Float dudt = std::abs(dtdu) < 1e-8f ? 0 : 1 / dtdu;
            Float dvdt = std::abs(dtdv) < 1e-8f ? 0 : 1 / dtdv;

            // Compute partial derivatives of $\pt{}$ with respect to interpolated texture
            // coordinates
            Vector3f dpds = dpdu * duds + dpdv * dvds;
            Vector3f dpdt = dpdu * dudt + dpdv * dvdt;

            // Set _dpdu_ and _dpdt_ to updated partial derivatives
            if (Cross(dpds, dpdt) != Vector3f(0, 0, 0)) {
                if (Dot(Cross(dpdu, dpdv), Cross(dpds, dpdt)) < 0)
                    dpdt = -dpdt;
                CHECK_GE(Dot(Normalize(Cross(dpdu, dpdv)), Normalize(Cross(dpds, dpdt))),
                         -1e-3);
                dpdu = dpds;
                dpdv = dpdt;
            }
        }
        // Find partial derivatives $\dndu$ and $\dndv$ for bilinear patch
        Vector3f d2Pduu(0, 0, 0), d2Pdvv(0, 0, 0);
        Vector3f d2Pduv(p00.x - p01.x - p10.x + p11.x, p00.y - p01.y - p10.y + p11.y,
                        p00.z - p01.z - p10.z + p11.z);
        // Compute coefficients for fundamental forms
        Float E = Dot(dpdu, dpdu);
        Float F = Dot(dpdu, dpdv);
        Float G = Dot(dpdv, dpdv);
        Vector3f N = Normalize(Cross(dpdu, dpdv));
        Float e = Dot(N, d2Pduu);
        Float f = Dot(N, d2Pduv);
        Float g = Dot(N, d2Pdvv);

        // Compute $\dndu$ and $\dndv$ from fundamental form coefficients
        Float EGF2 = DifferenceOfProducts(E, G, F, F);
        Float invEGF2 = (EGF2 == 0) ? Float(0) : 1 / EGF2;
        Normal3f dndu =
            Normal3f((f * F - e * G) * invEGF2 * dpdu + (e * F - f * E) * invEGF2 * dpdv);
        Normal3f dndv =
            Normal3f((g * F - f * G) * invEGF2 * dpdu + (f * F - g * E) * invEGF2 * dpdv);

        // Initialize bilinear patch intersection point error _pError_
        Vector3f pError =
            gamma(4) * Vector3f(Max(Max(Abs(p00), Abs(p10)), Max(Abs(p01), Abs(p11))));

        // Initialize _SurfaceInteraction_ for bilinear patch intersection
        int faceIndex = mesh->faceIndices ? mesh->faceIndices[patchIndex] : 0;
        bool flipNormal = mesh->reverseOrientation ^ mesh->transformSwapsHandedness;
        SurfaceInteraction isect(Point3fi(pHit, pError), uvTex, wo, dpdu, dpdv, dndu,
                                 dndv, time, flipNormal, faceIndex);

        if (mesh->n != nullptr) {
            // Compute shading normals for bilinear patch intersection point
            Normal3f n00 = mesh->n[v[0]], n10 = mesh->n[v[1]], n01 = mesh->n[v[2]],
                     n11 = mesh->n[v[3]];
            Normal3f ns = Lerp(uv[0], Lerp(uv[1], n00, n01), Lerp(uv[1], n10, n11));
            if (LengthSquared(ns) > 0) {
                ns = Normalize(ns);
                Normal3f n = Normal3f(Normalize(isect.n));
                Vector3f axis = Cross(Vector3f(n), Vector3f(ns));
                if (LengthSquared(axis) > 1e-14f) {
                    // Set shading geometry for bilinear patch intersection
                    Normal3f dndu = Lerp(uv[1], n10, n11) - Lerp(uv[1], n00, n01);
                    Normal3f dndv = Lerp(uv[0], n01, n11) - Lerp(uv[0], n00, n10);
                    axis = Normalize(axis);
                    Float cosTheta = Dot(n, ns),
                          sinTheta = SafeSqrt(1 - cosTheta * cosTheta);
                    Transform r = Rotate(sinTheta, cosTheta, axis);
                    Vector3f sdpdu = r(dpdu), sdpdv = r(dpdv);
                    sdpdu = GramSchmidt(sdpdu, Vector3f(ns));
                    isect.SetShadingGeometry(ns, sdpdu, sdpdv, dndu, dndv, true);
                }
            }
        }
        return isect;
    }